

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testDeserializeAndValidateQuoteRequest(int count)

{
  __time_t _Var1;
  __time_t _Var2;
  __suseconds_t _Var3;
  int iVar4;
  string string;
  NoRelatedSym noRelatedSym;
  QuoteRequest message;
  undefined1 local_278 [16];
  _Alloc_hider local_268 [2];
  char local_258 [16];
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  field_metrics local_228;
  timeval local_220;
  long local_210 [2];
  undefined1 local_200 [16];
  _Alloc_hider local_1f0;
  char local_1e0 [16];
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  field_metrics local_1b0;
  uint local_190;
  QuoteRequest local_188;
  
  local_278._0_8_ = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"1","");
  local_200._0_8_ = &PTR__FieldBase_0011c4d8;
  local_200._8_4_ = 0x83;
  local_1f0._M_p = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_278._0_8_,
             (long)(pointer *)local_278._0_8_ + CONCAT44(local_278._12_4_,local_278._8_4_));
  local_1d0._M_p = (pointer)&local_1c0;
  local_1c8 = 0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0.m_length = 0;
  local_1b0.m_checksum = 0;
  local_200._0_8_ = &PTR__FieldBase_0011c8d8;
  FIX42::QuoteRequest::QuoteRequest(&local_188,(QuoteReqID *)local_200);
  FIX::FieldBase::~FieldBase((FieldBase *)local_200);
  if ((_Alloc_hider *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268[0]._M_p + 1));
  }
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)local_200);
  iVar4 = 10;
  do {
    local_220.tv_sec = (__time_t)local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"IBM","");
    local_278._0_8_ = &PTR__FieldBase_0011c4d8;
    local_278._8_4_ = 0x37;
    local_268[0]._M_p = local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,local_220.tv_sec,local_220.tv_usec + local_220.tv_sec);
    local_248._M_p = (pointer)&local_238;
    local_240 = 0;
    local_238._M_local_buf[0] = '\0';
    local_228.m_length = 0;
    local_228.m_checksum = 0;
    local_278._0_8_ = &PTR__FieldBase_0011c600;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_278,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_278);
    if ((long *)local_220.tv_sec != local_210) {
      operator_delete((void *)local_220.tv_sec,local_210[0] + 1);
    }
    FIX::StringField::StringField((StringField *)local_278,200);
    local_278._0_8_ = &PTR__FieldBase_0011c750;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_278,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_278);
    FIX::IntField::IntField((IntField *)local_278,0xc9,0);
    local_278._0_8_ = &PTR__FieldBase_0011c788;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_278,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_278);
    FIX::DoubleField::DoubleField((DoubleField *)local_278,0xca,120.0,0);
    local_278._0_8_ = &PTR__FieldBase_0011c7f8;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_278,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_278);
    FIX::CharField::CharField((CharField *)local_278,0x36,'1');
    local_278._0_8_ = &PTR__FieldBase_0011c638;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_278,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_278);
    FIX::DoubleField::DoubleField((DoubleField *)local_278,0x26,100.0,0);
    local_278._0_8_ = &PTR__FieldBase_0011c868;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_278,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_278);
    local_220.tv_sec = (__time_t)local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"USD","");
    local_278._0_8_ = &PTR__FieldBase_0011c4d8;
    local_278._8_4_ = 0xf;
    local_268[0]._M_p = local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,local_220.tv_sec,local_220.tv_usec + local_220.tv_sec);
    local_248._M_p = (pointer)&local_238;
    local_240 = 0;
    local_238._M_local_buf[0] = '\0';
    local_228.m_length = 0;
    local_228.m_checksum = 0;
    local_278._0_8_ = &PTR__FieldBase_0011c8a0;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_278,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_278);
    if ((long *)local_220.tv_sec != local_210) {
      operator_delete((void *)local_220.tv_sec,local_210[0] + 1);
    }
    FIX::CharField::CharField((CharField *)local_278,0x28,'1');
    local_278._0_8_ = &PTR__FieldBase_0011c6e0;
    FIX::FieldMap::setField((FieldMap *)local_200,(FieldBase *)local_278,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_278);
    FIX::FieldMap::addGroup((int)&local_188,(FieldMap *)(ulong)local_190,false);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  FIX::Message::toString_abi_cxx11_((int)local_278,(int)&local_188,8);
  gettimeofday(&local_220,(__timezone_ptr_t)0x0);
  _Var3 = local_220.tv_usec;
  _Var1 = local_220.tv_sec;
  if (0 < count) {
    do {
      FIX::Message::setString
                ((string *)&local_188,SUB81(local_278,0),(DataDictionary *)0x1,
                 (DataDictionary *)
                 s_dataDictionary._M_t.
                 super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>
                 .super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl);
      count = count + -1;
    } while (count != 0);
  }
  gettimeofday(&local_220,(__timezone_ptr_t)0x0);
  _Var2 = local_220.tv_sec;
  if ((_Alloc_hider *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268[0]._M_p + 1));
  }
  FIX::FieldMap::~FieldMap((FieldMap *)local_200);
  FIX::Message::~Message((Message *)&local_188);
  return (local_220.tv_usec - (_Var3 + (long)((double)_Var1 * 1000000.0))) +
         (long)((double)_Var2 * 1000000.0);
}

Assistant:

long testDeserializeAndValidateQuoteRequest(int count) {
  FIX42::QuoteRequest message(FIX::QuoteReqID("1"));
  FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

  for (int i = 1; i <= 10; ++i) {
    noRelatedSym.set(FIX::Symbol("IBM"));
    noRelatedSym.set(FIX::MaturityMonthYear());
    noRelatedSym.set(FIX::PutOrCall(FIX::PutOrCall_PUT));
    noRelatedSym.set(FIX::StrikePrice(120));
    noRelatedSym.set(FIX::Side(FIX::Side_BUY));
    noRelatedSym.set(FIX::OrderQty(100));
    noRelatedSym.set(FIX::Currency("USD"));
    noRelatedSym.set(FIX::OrdType(FIX::OrdType_MARKET));
    message.addGroup(noRelatedSym);
  }
  std::string string = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for (int j = 0; j <= count; ++j) {
    message.setString(string, VALIDATE, s_dataDictionary.get());
  }
  return GetTickCount() - start;
}